

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BeginGlobal
          (BinaryReaderInterp *this,Index index,Type type,bool mutable_)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  Mutability mut;
  value_type local_78;
  ValueType local_44;
  undefined1 local_40 [8];
  GlobalType global_type;
  bool mutable__local;
  Index index_local;
  BinaryReaderInterp *this_local;
  Type type_local;
  
  global_type.mut = type.enum_;
  this_local._0_4_ = type.enum_;
  global_type._20_4_ =
       SharedValidator::OnGlobal
                 (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,type,
                  mutable_);
  bVar2 = Failed((Result)global_type._20_4_);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_44.enum_ = this_local._0_4_;
    mut = ToMutability(mutable_);
    GlobalType::GlobalType((GlobalType *)local_40,local_44,mut);
    pMVar1 = this->module_;
    GlobalType::GlobalType(&local_78.type,(GlobalType *)local_40);
    memset(&local_78.init,0,0x18);
    std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::push_back
              (&pMVar1->globals,&local_78);
    GlobalDesc::~GlobalDesc(&local_78);
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,(value_type *)local_40);
    (this->init_expr_).kind = None;
    Result::Result((Result *)((long)&this_local + 4),Ok);
    GlobalType::~GlobalType((GlobalType *)local_40);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::BeginGlobal(Index index, Type type, bool mutable_) {
  CHECK_RESULT(validator_.OnGlobal(loc, type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  module_.globals.push_back(GlobalDesc{global_type, InitExpr{}});
  global_types_.push_back(global_type);
  init_expr_.kind = InitExprKind::None;
  return Result::Ok;
}